

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

string * __thiscall
sqlite_orm::internal::
table_t<relive::Station,sqlite_orm::internal::column_t<relive::Station,long,long_const&(relive::Station::*)()const,void(relive::Station::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Station,long,long_const&(relive::Station::*)()const,void(relive::Station::*)(long)>,sqlite_orm::internal::column_t<relive::Station,int,int_const&(relive::Station::*)()const,void(relive::Station::*)(int)>,sqlite_orm::internal::column_t<relive::Station,std::__cxx11::string,std::__cxx11::string_const&(relive::Station::*)()const,void(relive::Station::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Station,long,long_const&(relive::Station::*)()const,void(relive::Station::*)(long)>,sqlite_orm::internal::column_t<relive::Station,int,int_const&(relive::Station::*)()const,void(relive::Station::*)(int)>,sqlite_orm::internal::column_t<relive::Station,std::__cxx11::string,std::__cxx11::string_const&(relive::Station::*)()const,void(relive::Station::*)(std::__cxx11::string)>>
::find_column_name<long,relive::Station,void>
          (string *__return_storage_ptr__,void *this,offset_in_Station_to_long m)

{
  iterator<4ul,sqlite_orm::internal::column_t<relive::Station,long,long_const&(relive::Station::*)()const,void(relive::Station::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Station,long,long_const&(relive::Station::*)()const,void(relive::Station::*)(long)>,sqlite_orm::internal::column_t<relive::Station,int,int_const&(relive::Station::*)()const,void(relive::Station::*)(int)>,sqlite_orm::internal::column_t<relive::Station,std::__cxx11::string,std::__cxx11::string_const&(relive::Station::*)()const,void(relive::Station::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Station,long,long_const&(relive::Station::*)()const,void(relive::Station::*)(long)>,sqlite_orm::internal::column_t<relive::Station,int,int_const&(relive::Station::*)()const,void(relive::Station::*)(int)>,sqlite_orm::internal::column_t<relive::Station,std::__cxx11::string,std::__cxx11::string_const&(relive::Station::*)()const,void(relive::Station::*)(std::__cxx11::string)>>
  local_31;
  anon_class_8_1_54a3980c local_30;
  anon_class_16_2_de34c1f6 local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_30.l = &local_28;
  local_28.res = __return_storage_ptr__;
  local_28.m = m;
  tuple_helper::
  iterator<4ul,sqlite_orm::internal::column_t<relive::Station,long,long_const&(relive::Station::*)()const,void(relive::Station::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Station,long,long_const&(relive::Station::*)()const,void(relive::Station::*)(long)>,sqlite_orm::internal::column_t<relive::Station,int,int_const&(relive::Station::*)()const,void(relive::Station::*)(int)>,sqlite_orm::internal::column_t<relive::Station,std::__cxx11::string,std::__cxx11::string_const&(relive::Station::*)()const,void(relive::Station::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Station,long,long_const&(relive::Station::*)()const,void(relive::Station::*)(long)>,sqlite_orm::internal::column_t<relive::Station,int,int_const&(relive::Station::*)()const,void(relive::Station::*)(int)>,sqlite_orm::internal::column_t<relive::Station,std::__cxx11::string,std::__cxx11::string_const&(relive::Station::*)()const,void(relive::Station::*)(std::__cxx11::string)>>
  ::operator()(&local_31,
               (tuple<sqlite_orm::internal::column_t<relive::Station,_long,_const_long_&(relive::Station::*)()_const,_void_(relive::Station::*)(long),_sqlite_orm::constraints::autoincrement_t,_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::Station,_long,_const_long_&(relive::Station::*)()_const,_void_(relive::Station::*)(long)>,_sqlite_orm::internal::column_t<relive::Station,_int,_const_int_&(relive::Station::*)()_const,_void_(relive::Station::*)(int)>,_sqlite_orm::internal::column_t<relive::Station,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Station::*)()_const,_void_(relive::Station::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_sqlite_orm::internal::column_t<relive::Station,_long,_const_long_&(relive::Station::*)()_const,_void_(relive::Station::*)(long)>,_sqlite_orm::internal::column_t<relive::Station,_int,_const_int_&(relive::Station::*)()_const,_void_(relive::Station::*)(int)>,_sqlite_orm::internal::column_t<relive::Station,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Station::*)()_const,_void_(relive::Station::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
                *)((long)this + 0x28),&local_30,false);
  return __return_storage_ptr__;
}

Assistant:

std::string find_column_name(F O::*m) const {
        std::string res;
        this->template for_each_column_with_field_type<F>([&res, m](auto &c) {
          if(c.member_pointer == m) {
              res = c.name;
          }
        });
        return res;
    }